

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::mouse_moved(Application *this,float x,float y)

{
  float local_2c;
  undefined1 local_28 [8];
  Vector2D p;
  float y_local;
  float x_local;
  Application *this_local;
  
  local_2c = (float)this->screenH;
  p.y._0_4_ = local_2c - y;
  p.y._4_4_ = x;
  Vector2D::Vector2D((Vector2D *)local_28,(double)x,(double)p.y._0_4_);
  update_gl_camera(this);
  if (*(int *)&(this->super_Renderer).field_0xc == 0) {
    DynamicScene::Scene::getHoveredObject(this->scene,(Vector2D *)local_28,true,false);
  }
  else if (*(int *)&(this->super_Renderer).field_0xc == 2) {
    if (this->action == Wave) {
      DynamicScene::Scene::getHoveredObject(this->scene,(Vector2D *)local_28,true,true);
    }
    else {
      DynamicScene::Scene::getHoveredObject(this->scene,(Vector2D *)local_28,false,true);
    }
  }
  return;
}

Assistant:

void Application::mouse_moved(float x, float y) {
  y = screenH - y; // Because up is down.
  // Converts x from [0, w] to [-1, 1], and similarly for y.
  //Vector2D p(x * 2 / screenW - 1, y * 2 / screenH - 1);
  Vector2D p(x,y);
  update_gl_camera();
  if (mode == MODEL_MODE) {
    scene->getHoveredObject(p);
  }
  else if (mode == ANIMATE_MODE) {
    if (action == Action::Wave) {
      scene->getHoveredObject(p, true, true);
    } else {
      scene->getHoveredObject(p, false, true);
    }
  }
}